

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O0

void __thiscall riffcpp::Chunk::Chunk(Chunk *this,Chunk *ch)

{
  impl *piVar1;
  impl *piVar2;
  Chunk *ch_local;
  Chunk *this_local;
  
  piVar2 = (impl *)operator_new(0x48);
  (piVar2->m_limit)._M_off = 0;
  (piVar2->m_limit)._M_state.__count = 0;
  (piVar2->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (piVar2->m_pos)._M_off = 0;
  (piVar2->m_pos)._M_state.__count = 0;
  (piVar2->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (piVar2->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (piVar2->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar2->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (piVar2->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar2->m_id = (_Type)0x0;
  piVar2->m_size = 0;
  impl::impl(piVar2);
  this->pimpl = piVar2;
  std::shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>_>::operator=
            (&this->pimpl->m_buf,&ch->pimpl->m_buf);
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::operator=
            (&this->pimpl->m_stream,&ch->pimpl->m_stream);
  piVar2 = ch->pimpl;
  piVar1 = this->pimpl;
  (piVar1->m_pos)._M_off = (piVar2->m_pos)._M_off;
  (piVar1->m_pos)._M_state = (piVar2->m_pos)._M_state;
  piVar2 = ch->pimpl;
  piVar1 = this->pimpl;
  (piVar1->m_limit)._M_off = (piVar2->m_limit)._M_off;
  (piVar1->m_limit)._M_state = (piVar2->m_limit)._M_state;
  *(undefined4 *)(this->pimpl->m_id)._M_elems = *(undefined4 *)(ch->pimpl->m_id)._M_elems;
  this->pimpl->m_size = ch->pimpl->m_size;
  return;
}

Assistant:

riffcpp::Chunk::Chunk(const Chunk &ch) {
  pimpl = new riffcpp::Chunk::impl();
  pimpl->m_buf = ch.pimpl->m_buf;
  pimpl->m_stream = ch.pimpl->m_stream;
  pimpl->m_pos = ch.pimpl->m_pos;
  pimpl->m_limit = ch.pimpl->m_limit;
  pimpl->m_id = ch.pimpl->m_id;
  pimpl->m_size = ch.pimpl->m_size;
}